

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controlbits.c
# Opt level: O1

void controlbitsfrompermutation(int w,int n,int step,int off,uchar *c,uint32_t *pi)

{
  uchar *c_00;
  uint32_t *pi_00;
  undefined8 uVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  undefined4 in_register_00000014;
  ulong uVar8;
  uint32_t *puVar9;
  long lVar10;
  undefined4 in_register_00000034;
  uint32_t *puVar11;
  long lVar12;
  undefined4 in_register_0000003c;
  uint32_t *pi_01;
  int iVar13;
  uint32_t *puVar14;
  uint32_t *x;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  undefined1 auVar31 [16];
  uint32_t auStack_b0 [2];
  uint32_t auStack_a8 [2];
  undefined8 local_a0;
  ulong local_98;
  uint32_t *local_90;
  uint32_t *local_88;
  undefined8 local_80;
  uchar *local_78;
  ulong local_70;
  uint32_t *local_68;
  int local_5c;
  undefined8 local_58;
  uint32_t *local_50;
  ulong local_48;
  ulong local_40;
  undefined8 local_38;
  
  local_58 = CONCAT44(in_register_0000003c,w);
  local_38 = CONCAT44(in_register_00000034,n);
  local_80 = CONCAT44(in_register_00000014,step);
  local_98 = (ulong)(uint)off;
  uVar8 = (ulong)(uint)n;
  uVar2 = uVar8 * 4 + 0xf & 0xfffffffffffffff0;
  lVar12 = -uVar2;
  puVar14 = (uint32_t *)((long)auStack_a8 + lVar12);
  local_40 = (ulong)(uint)(n * 2);
  uVar4 = local_40 * 4 + 0xf & 0xfffffffffffffff0;
  local_50 = (uint32_t *)((long)puVar14 - uVar4);
  x = (uint32_t *)((long)local_50 - uVar4);
  puVar9 = (uint32_t *)((long)((long)x - uVar4) - uVar4);
  local_a0 = (long)puVar9 - uVar2;
  local_48 = (ulong)(uint)(n / 2);
  puVar11 = (uint32_t *)(local_a0 - (local_48 * 8 + 0xf & 0xfffffffffffffff0));
  if (w == 1) {
    iVar13 = off + 7;
    if (-1 < off) {
      iVar13 = off;
    }
    c[iVar13 >> 3] = c[iVar13 >> 3] | (byte)((*pi & 1) << ((byte)off & 7));
  }
  if (1 < w) {
    local_78 = c;
    local_68 = pi;
    if (0 < n) {
      lVar10 = uVar8 - 1;
      auVar16._8_4_ = (int)lVar10;
      auVar16._0_8_ = lVar10;
      auVar16._12_4_ = (int)((ulong)lVar10 >> 0x20);
      uVar2 = 0;
      auVar16 = auVar16 ^ _DAT_00108230;
      auVar31 = _DAT_00108170;
      do {
        auVar23 = auVar31 ^ _DAT_00108230;
        if ((bool)(~(auVar23._4_4_ == auVar16._4_4_ && auVar16._0_4_ < auVar23._0_4_ ||
                    auVar16._4_4_ < auVar23._4_4_) & 1)) {
          puVar14[uVar2] = (uint32_t)uVar2;
        }
        if ((auVar23._12_4_ != auVar16._12_4_ || auVar23._8_4_ <= auVar16._8_4_) &&
            auVar23._12_4_ <= auVar16._12_4_) {
          *(uint32_t *)((long)auStack_a8 + uVar2 * 4 + lVar12 + 4) = (uint32_t)uVar2 + 1;
        }
        uVar2 = uVar2 + 2;
        lVar10 = auVar31._8_8_;
        auVar31._0_8_ = auVar31._0_8_ + 2;
        auVar31._8_8_ = lVar10 + 2;
      } while ((n + 1U & 0xfffffffe) != uVar2);
    }
    pi_00 = local_68;
    iVar13 = (int)local_38;
    local_90 = puVar11;
    local_88 = (uint32_t *)((long)x - uVar4);
    local_70 = uVar8;
    puVar11[-2] = 0x102ffa;
    puVar11[-1] = 0;
    composeinv(iVar13,puVar14,puVar14,pi_00);
    pi_01 = local_50;
    bVar3 = (byte)local_58;
    if (0 < iVar13) {
      uVar2 = 0;
      do {
        local_50[uVar2] = puVar14[uVar2] | 1 << (bVar3 & 0x1f);
        local_50[local_70 + uVar2] = pi_00[uVar2];
        uVar2 = uVar2 + 1;
      } while (local_70 != uVar2);
    }
    iVar13 = (int)local_58;
    if (0 < (int)local_38) {
      uVar2 = 1;
      if (1 < (int)local_40) {
        uVar2 = local_40 & 0xffffffff;
      }
      uVar5 = (1 << (bVar3 & 0x1f)) - 2;
      lVar12 = uVar2 - 1;
      auVar17._8_4_ = (int)lVar12;
      auVar17._0_8_ = lVar12;
      auVar17._12_4_ = (int)((ulong)lVar12 >> 0x20);
      uVar25 = 0;
      uVar26 = 1;
      uVar27 = 2;
      uVar28 = 3;
      lVar12 = 0;
      auVar17 = auVar17 ^ _DAT_00108230;
      auVar24._4_12_ = SUB1612((undefined1  [16])0x0,4);
      auVar24._0_4_ = iVar13;
      auVar23 = _DAT_001082a0;
      auVar18 = _DAT_00108170;
      uVar29 = uVar26;
      uVar30 = uVar28;
      uVar19 = uVar25;
      uVar20 = uVar26;
      uVar21 = uVar27;
      uVar22 = uVar28;
      do {
        auVar31 = auVar18 ^ _DAT_00108230;
        iVar7 = auVar17._4_4_;
        lVar10 = auVar24._0_8_;
        if ((bool)(~(auVar31._4_4_ == iVar7 && auVar17._0_4_ < auVar31._0_4_ ||
                    iVar7 < auVar31._4_4_) & 1)) {
          *(uint *)((long)x + lVar12) = (0 << iVar13) + (uVar5 & uVar25) + (uVar19 >> lVar10);
        }
        if ((auVar31._12_4_ != auVar17._12_4_ || auVar31._8_4_ <= auVar17._8_4_) &&
            auVar31._12_4_ <= auVar17._12_4_) {
          *(uint *)((long)x + lVar12 + 4) = (uVar29 & 1) + (uVar5 & uVar26) + (uVar20 >> lVar10);
        }
        iVar6 = SUB164(auVar23 ^ _DAT_00108230,4);
        if (iVar6 <= iVar7 && (iVar6 != iVar7 || SUB164(auVar23 ^ _DAT_00108230,0) <= auVar17._0_4_)
           ) {
          *(uint *)((long)x + lVar12 + 8) = (uVar5 & uVar27) + (uVar21 >> lVar10);
          *(uint *)((long)x + lVar12 + 0xc) = (uVar30 & 1) + (uVar5 & uVar28) + (uVar22 >> lVar10);
        }
        lVar10 = auVar18._8_8_;
        auVar18._0_8_ = auVar18._0_8_ + 4;
        auVar18._8_8_ = lVar10 + 4;
        lVar10 = auVar23._8_8_;
        auVar23._0_8_ = auVar23._0_8_ + 4;
        auVar23._8_8_ = lVar10 + 4;
        uVar19 = uVar19 + 4;
        uVar20 = uVar20 + 4;
        uVar21 = uVar21 + 4;
        uVar22 = uVar22 + 4;
        uVar25 = uVar25 + 4;
        uVar26 = uVar26 + 4;
        uVar27 = uVar27 + 4;
        uVar28 = uVar28 + 4;
        uVar29 = uVar29 + 4;
        uVar30 = uVar30 + 4;
        lVar12 = lVar12 + 0x10;
      } while ((ulong)((int)uVar2 + 3U & 0xfffffffc) << 2 != lVar12);
    }
    uVar29 = ~(-1 << (bVar3 & 0x1f));
    uVar2 = 1;
    if (1 < (int)local_40) {
      uVar2 = local_40 & 0xffffffff;
    }
    local_5c = 1;
    if (1 < iVar13) {
      local_5c = iVar13;
    }
    iVar13 = 0;
    do {
      uVar4 = local_40;
      puVar14 = local_88;
      puVar11[-2] = 0x10321f;
      puVar11[-1] = 0;
      composeinv((int)uVar4,puVar14,x,pi_01);
      uVar1 = local_58;
      puVar14 = local_88;
      if (0 < (int)local_38) {
        uVar4 = 0;
        do {
          bVar15 = (puVar14[uVar4] & uVar29) < (x[uVar4] & uVar29);
          uVar30 = x[uVar4];
          if (bVar15) {
            uVar30 = puVar14[uVar4];
          }
          x[uVar4] = (uint)(bVar15 && iVar13 != 0) << ((byte)uVar1 & 0x1f) ^ uVar30;
          uVar4 = uVar4 + 1;
        } while (uVar2 != uVar4);
      }
      puVar14 = local_50;
      if (0 < (int)local_38) {
        uVar4 = 0;
        do {
          puVar9[uVar4] = puVar14[uVar4 ^ 1];
          uVar4 = uVar4 + 1;
        } while (uVar2 != uVar4);
      }
      uVar4 = local_40;
      puVar11[-2] = 0x10329a;
      puVar11[-1] = 0;
      composeinv((int)uVar4,puVar14,puVar14,puVar9);
      if (0 < (int)local_38) {
        uVar4 = 0;
        do {
          puVar9[uVar4] = x[uVar4 ^ 1];
          uVar4 = uVar4 + 1;
        } while (uVar2 != uVar4);
      }
      uVar30 = (uint)local_58;
      bVar3 = (byte)local_58;
      if (0 < (int)local_38) {
        uVar4 = 0;
        do {
          bVar15 = (puVar9[uVar4] & uVar29) < (x[uVar4] & uVar29);
          uVar19 = x[uVar4];
          if (bVar15) {
            uVar19 = puVar9[uVar4];
          }
          x[uVar4] = (uint)bVar15 << (bVar3 & 0x1f) ^ uVar19;
          uVar4 = uVar4 + 1;
        } while (uVar2 != uVar4);
      }
      iVar13 = iVar13 + 1;
      pi_01 = local_50;
    } while (iVar13 != local_5c);
    if (0 < (int)local_38) {
      uVar2 = 0;
      do {
        *(uint32_t *)(local_a0 + uVar2 * 4) = local_68[uVar2];
        uVar2 = uVar2 + 1;
      } while (local_70 != uVar2);
    }
    uVar2 = local_48 & 0xffffffff;
    iVar13 = (int)local_80;
    if (1 < (int)local_38) {
      uVar4 = 0;
      uVar8 = local_98 & 0xffffffff;
      do {
        iVar6 = (int)uVar8;
        iVar7 = iVar6 + 7;
        if (-1 < iVar6) {
          iVar7 = iVar6;
        }
        local_78[iVar7 >> 3] =
             local_78[iVar7 >> 3] |
             ((x[uVar4 * 2] >> (uVar30 & 0x1f) & 1) != 0) << ((byte)uVar8 & 7);
        uVar4 = uVar4 + 1;
        uVar8 = (ulong)(uint)(iVar6 + iVar13);
      } while (uVar2 != uVar4);
    }
    if (1 < (int)local_38) {
      iVar7 = iVar13 * (int)local_38 * (uVar30 - 1) + (int)local_98;
      uVar4 = 0;
      do {
        iVar6 = iVar7 + 7;
        if (-1 < iVar7) {
          iVar6 = iVar7;
        }
        local_78[iVar6 >> 3] =
             local_78[iVar6 >> 3] |
             ((x[local_70 + uVar4 * 2] >> (uVar30 & 0x1f) & 1) != 0) << ((byte)iVar7 & 7);
        uVar4 = uVar4 + 1;
        iVar7 = iVar7 + iVar13;
      } while (uVar2 != uVar4);
    }
    if (1 < (int)local_38) {
      uVar4 = 0;
      do {
        uVar29 = *(uint *)(local_a0 + uVar4 * 8);
        uVar19 = *(uint *)(local_a0 + 4 + uVar4 * 8);
        uVar20 = x[local_70 + uVar4 * 2] & 1 << (bVar3 & 0x1f);
        if (uVar20 != 0) {
          uVar20 = uVar19 ^ uVar29;
        }
        *(uint *)(local_a0 + uVar4 * 8) = uVar29 ^ uVar20;
        *(uint *)(local_a0 + 4 + uVar4 * 8) = uVar20 ^ uVar19;
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
    puVar9 = local_90;
    lVar12 = 0;
    lVar10 = local_a0;
    do {
      if (1 < (int)local_38) {
        uVar4 = 0;
        do {
          puVar9[uVar4] = *(uint *)(lVar10 + uVar4 * 8) >> 1;
          uVar4 = uVar4 + 1;
        } while (uVar2 != uVar4);
      }
      lVar10 = lVar10 + 4;
      puVar9 = puVar9 + uVar2;
      bVar15 = lVar12 == 0;
      lVar12 = lVar12 + 1;
    } while (bVar15);
    local_38 = CONCAT44(local_38._4_4_,iVar13 * 2);
    iVar13 = (int)local_98 + (int)local_48 * iVar13;
    lVar12 = 1;
    puVar9 = local_90;
    do {
      uVar4 = local_48;
      c_00 = local_78;
      iVar7 = (int)local_38;
      puVar11[-2] = 0x103489;
      puVar11[-1] = 0;
      controlbitsfrompermutation(uVar30 - 1,(int)uVar4,iVar7,iVar13,c_00,puVar9);
      iVar13 = iVar13 + (int)local_80;
      puVar9 = puVar9 + uVar2;
      lVar12 = lVar12 + -1;
    } while (lVar12 == 0);
  }
  return;
}

Assistant:

static void controlbitsfrompermutation(int w, int n, int step, int off, unsigned char *c, uint32_t pi[n])
{
  int i;
  int j;
  int k;
  int t;
  uint32_t ip[n];
  uint32_t I[2 * n];
  uint32_t P[2 * n];
  uint32_t PI[2 * n];
  uint32_t T[2 * n];
  uint32_t piflip[n];
  uint32_t subpi[2][n / 2];

  if (w == 1) c[ off/8 ] |= (pi[0] & 1) << (off%8);
  if (w <= 1) return;

  invert(n,ip,pi);

  for (i = 0;i < n;++i) 
  {
    I[i] = ip[i] | (1 << w);
    I[n + i] = pi[i];
  }

  for (i = 0;i < 2 * n;++i)
      P[i] = (i >> w) + (i & ((1<<w)-2)) + ((i & 1) << w);

  for (t = 0;t < w;++t) 
  {
    composeinv(2 * n,PI,P,I);

    for (i = 0;i < 2 * n;++i)
      flow(w,&P[i],&PI[i],t);

    for (i = 0;i < 2 * n;++i)
	T[i] = I[i ^ 1];

    composeinv(2 * n,I,I,T);

    for (i = 0;i < 2 * n;++i)
	T[i] = P[i ^ 1];

    for (i = 0;i < 2 * n;++i)
      flow(w,&P[i],&T[i],1);
  }

  for (i = 0;i < n;++i)
    for (j = 0;j < w;++j)
      piflip[i] = pi[i];

  for (i = 0;i < n / 2;++i) c[ (off + i * step)/8 ] |= ((P[i * 2] >> w) & 1) << ((off + i * step)%8);
  for (i = 0;i < n / 2;++i) c[ (off + ((w-1)*n + i) * step)/8 ] |= ((P[n + i * 2] >> w) & 1) << ((off + ((w-1)*n + i) * step)%8);

  for (i = 0;i < n / 2;++i)
    cswap(&piflip[i * 2], &piflip[i * 2 + 1], (P[n + i * 2] >> w) & 1);

  for (k = 0;k < 2;++k)
    for (i = 0;i < n / 2;++i)
        subpi[k][i] = piflip[i * 2 + k] >> 1;

  for (k = 0;k < 2;++k)
    controlbitsfrompermutation(w - 1, n / 2, step * 2, off + step * (n/2 + k), c, subpi[k]);
}